

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_compress_generic
              (LZ4_stream_t_internal *cctx,char *src,char *dst,int srcSize,int *inputConsumed,
              int dstCapacity,limitedOutput_directive outputDirective,tableType_t tableType,
              dict_directive dictDirective,dictIssue_directive dictIssue,int acceleration)

{
  long lVar1;
  long *pInLimit;
  uint uVar2;
  uint uVar3;
  LZ4_stream_t_internal *pLVar4;
  int *piVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  LZ4_stream_t_internal *pLVar11;
  long lVar12;
  char *pcVar13;
  dict_directive dVar14;
  int iVar15;
  BYTE *srcBase;
  int *piVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long *plVar20;
  long *plVar21;
  int *piVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  long *plVar26;
  short *psVar27;
  BYTE *e;
  short *psVar28;
  U32 *hashTable;
  char *pcVar29;
  long *local_c8;
  int local_bc;
  int *local_b0;
  long local_a0;
  U32 *hashTable_2;
  
  iVar24 = 0;
  if ((uint)srcSize < 0x7e000001) {
    if (srcSize == 0) {
      iVar24 = 0;
      if (0 < dstCapacity || outputDirective == notLimited) {
        *dst = '\0';
        iVar24 = 1;
        if (outputDirective == fillOutput) {
          *inputConsumed = 0;
        }
      }
    }
    else {
      uVar2 = cctx->currentOffset;
      pLVar4 = cctx->dictCtx;
      iVar23 = 0;
      pLVar11 = cctx;
      if (dictDirective == usingDictCtx) {
        pLVar11 = pLVar4;
      }
      piVar5 = (int *)pLVar11->dictionary;
      uVar3 = pLVar11->dictSize;
      if (dictDirective == usingDictCtx) {
        iVar23 = uVar2 - pLVar4->currentOffset;
      }
      lVar1 = (long)piVar5 + (ulong)uVar3;
      if (piVar5 == (int *)0x0) {
        local_a0 = 0;
        lVar1 = 0;
      }
      else if (dictDirective == usingDictCtx) {
        local_a0 = lVar1 - (ulong)pLVar4->currentOffset;
      }
      else {
        local_a0 = lVar1 - (ulong)uVar2;
      }
      iVar24 = 0;
      if ((0 < dstCapacity || outputDirective != fillOutput) &&
         (iVar24 = 0, (uint)srcSize < 0x1000b || tableType != byU16)) {
        uVar17 = 0;
        if (dictDirective == withPrefix64k) {
          uVar17 = (ulong)uVar3;
        }
        if (dictDirective == usingDictCtx) {
          cctx->dictCtx = (LZ4_stream_t_internal *)0x0;
          cctx->dictSize = srcSize;
        }
        else {
          cctx->dictSize = cctx->dictSize + srcSize;
        }
        pcVar13 = dst + dstCapacity;
        cctx->currentOffset = uVar2 + srcSize;
        cctx->tableType = tableType;
        iVar24 = (int)dst;
        plVar26 = (long *)src;
        if (0xc < (uint)srcSize) {
          srcBase = (BYTE *)(src + -(ulong)uVar2);
          LZ4_putPosition((BYTE *)src,cctx,tableType,srcBase);
          plVar20 = (long *)(src + 1);
          if (tableType == byU16) {
            uVar25 = (ulong)((uint)((int)*plVar20 * -0x61c8864f) >> 0x13);
          }
          else {
            uVar25 = (ulong)(*plVar20 * -0x30e4432345000000) >> 0x34;
          }
          dVar14 = dictDirective & ~withPrefix64k;
          pInLimit = (long *)(src + ((ulong)(uint)srcSize - 5));
          local_b0 = (int *)(src + -uVar17);
          local_bc = 0;
          local_c8 = (long *)src;
LAB_01e1b4f4:
          iVar15 = 1;
          iVar8 = acceleration << 6;
          do {
            if (tableType == byU32) {
              uVar17 = (ulong)cctx->hashTable[uVar25];
            }
            else {
              uVar17 = (ulong)*(ushort *)((long)cctx->hashTable + uVar25 * 2);
            }
            plVar21 = (long *)((long)iVar15 + (long)plVar20);
            plVar26 = local_c8;
            if (src + ((ulong)(uint)srcSize - 0xb) < plVar21) break;
            if (dictDirective == usingDictCtx) {
              if ((uint)uVar17 < uVar2) {
                uVar17 = (ulong)pLVar4->hashTable[uVar25];
                uVar18 = (ulong)(pLVar4->hashTable[uVar25] + iVar23);
LAB_01e1b54c:
                piVar16 = (int *)(uVar17 + local_a0);
                uVar17 = uVar18;
                local_b0 = piVar5;
              }
              else {
LAB_01e1b558:
                piVar16 = (int *)(srcBase + uVar17);
                local_b0 = (int *)src;
              }
            }
            else {
              if (dictDirective == usingExtDict) {
                uVar18 = uVar17;
                if (uVar2 <= (uint)uVar17) goto LAB_01e1b558;
                goto LAB_01e1b54c;
              }
              piVar16 = (int *)(srcBase + uVar17);
            }
            uVar9 = (uint)((long)plVar20 - (long)srcBase);
            if (tableType == byU16) {
              uVar18 = (ulong)((uint)((int)*plVar21 * -0x61c8864f) >> 0x13);
              *(short *)((long)cctx->hashTable + uVar25 * 2) =
                   (short)((long)plVar20 - (long)srcBase);
            }
            else {
              uVar18 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
              cctx->hashTable[uVar25] = uVar9;
            }
            uVar10 = (uint)uVar17;
            if ((((dictIssue != dictSmall) || (uVar2 - uVar3 <= uVar10)) &&
                ((tableType == byU16 || (uVar9 <= uVar10 + 0xffff)))) && (*piVar16 == (int)*plVar20)
               ) goto LAB_01e1b5de;
            iVar15 = iVar8 >> 6;
            iVar8 = iVar8 + 1;
            uVar25 = uVar18;
            plVar20 = plVar21;
          } while( true );
        }
LAB_01e1bae5:
        pcVar29 = src + ((ulong)(uint)srcSize - (long)plVar26);
        local_c8 = plVar26;
        if (outputDirective != notLimited) {
LAB_01e1bafa:
          if (pcVar13 < (char *)((long)dst + (long)(pcVar29 + (ulong)(pcVar29 + 0xf0) / 0xff + 1)))
          {
            if (outputDirective != fillOutput) {
              return 0;
            }
            pcVar29 = pcVar13 + (~(ulong)dst - ((ulong)(pcVar13 + ~(ulong)dst + 0xf1) >> 8));
          }
        }
        if (pcVar29 < (char *)0xf) {
          *dst = (char)pcVar29 << 4;
        }
        else {
          *dst = -0x10;
          for (pcVar13 = pcVar29 + -0xf; dst = (char *)((long)dst + 1), (char *)0xfe < pcVar13;
              pcVar13 = pcVar13 + -0xff) {
            *dst = -1;
          }
          *dst = (char)pcVar13;
        }
        switchD_01939fa4::default((char *)((long)dst + 1),local_c8,(size_t)pcVar29);
        if (outputDirective == fillOutput) {
          *inputConsumed = ((int)local_c8 + (int)pcVar29) - (int)src;
        }
        iVar24 = ((int)dst + (int)pcVar29 + 1) - iVar24;
      }
    }
  }
  return iVar24;
LAB_01e1b5de:
  if (dVar14 == usingExtDict) {
    local_bc = uVar9 - uVar10;
  }
  iVar8 = (int)plVar20;
  lVar12 = 0;
  cVar6 = (char)plVar20 * '\x10' + (char)local_c8 * -0x10;
  do {
    cVar7 = cVar6;
    lVar19 = lVar12;
    piVar22 = (int *)((long)piVar16 + lVar19);
    plVar26 = (long *)(lVar19 + (long)plVar20);
    if ((piVar22 <= local_b0) || (plVar26 <= local_c8)) break;
    lVar12 = lVar19 + -1;
    cVar6 = cVar7 + -0x10;
  } while (*(char *)((long)plVar20 + lVar19 + -1) == *(char *)((long)piVar16 + lVar19 + -1));
  uVar25 = (long)plVar26 - (long)local_c8;
  iVar15 = (int)local_c8;
  uVar17 = (ulong)(uint)(iVar8 - iVar15) + lVar19;
  psVar27 = (short *)((long)dst + 1);
  if (outputDirective == limitedOutput) {
    if (pcVar13 < (char *)((long)psVar27 + (uVar17 & 0xffffffff) / 0xff + (uVar25 & 0xffffffff) + 8)
       ) {
      return 0;
    }
  }
  else if ((outputDirective == fillOutput) &&
          (pcVar13 < (char *)((long)psVar27 +
                             (uVar25 & 0xffffffff) +
                             (ulong)((iVar8 - iVar15) + (int)lVar19 + 0xf0) / 0xff + 0xb))) {
LAB_01e1bab7:
    pcVar29 = src + ((ulong)(uint)srcSize - (long)local_c8);
    goto LAB_01e1bafa;
  }
  if ((uint)uVar17 < 0xf) {
    *dst = cVar7;
  }
  else {
    *dst = -0x10;
    psVar27 = (short *)((long)dst + 2);
    for (iVar8 = (iVar8 - iVar15) + (int)lVar19 + -0xf; 0xfe < iVar8; iVar8 = iVar8 + -0xff) {
      *(char *)((long)psVar27 + -1) = -1;
      psVar27 = (short *)((long)psVar27 + 1);
    }
    *(char *)((long)psVar27 + -1) = (char)iVar8;
  }
  psVar28 = (short *)((uVar25 & 0xffffffff) + (long)psVar27);
  lVar12 = 0;
  do {
    pcVar29 = (char *)((long)psVar27 + lVar12);
    *(undefined8 *)pcVar29 = *(undefined8 *)((long)local_c8 + lVar12);
    lVar12 = lVar12 + 8;
  } while (pcVar29 + 8 < psVar28);
LAB_01e1b717:
  if ((outputDirective == fillOutput) && (pcVar13 < (char *)((long)psVar28 + 0xb)))
  goto LAB_01e1bab7;
  if (dVar14 == usingExtDict) {
    *psVar28 = (short)local_bc;
    if (local_b0 != piVar5) goto LAB_01e1b7c8;
    plVar21 = (long *)((lVar1 - (long)piVar22) + (long)plVar26);
    if (pInLimit < plVar21) {
      plVar21 = pInLimit;
    }
    uVar9 = LZ4_count((BYTE *)((long)plVar26 + 4),(BYTE *)(piVar22 + 1),(BYTE *)plVar21);
    plVar26 = (long *)((long)plVar26 + (ulong)uVar9 + 4);
    if (plVar26 == plVar21) {
      uVar10 = LZ4_count((BYTE *)plVar21,(BYTE *)src,(BYTE *)pInLimit);
      uVar9 = uVar9 + uVar10;
      plVar26 = (long *)((long)plVar26 + (ulong)uVar10);
    }
  }
  else {
    *psVar28 = (short)plVar26 - (short)piVar22;
LAB_01e1b7c8:
    uVar9 = LZ4_count((BYTE *)((long)plVar26 + 4),(BYTE *)(piVar22 + 1),(BYTE *)pInLimit);
    plVar26 = (long *)((long)plVar26 + (ulong)uVar9 + 4);
  }
  psVar27 = psVar28 + 1;
  uVar10 = uVar9;
  if ((outputDirective != notLimited) &&
     (pcVar13 < (char *)((long)psVar28 + (ulong)(uVar9 + 0xf0) / 0xff + 8))) {
    if (outputDirective != fillOutput) {
      return 0;
    }
    uVar10 = ((int)pcVar13 - (int)psVar27) * 0xff - 0x5ec;
    plVar26 = (long *)((long)plVar26 - (ulong)(uVar9 - uVar10));
    plVar21 = plVar26;
    if (plVar26 <= plVar20) {
      for (; plVar21 <= plVar20; plVar21 = (long *)((long)plVar21 + 1)) {
        if (tableType == byU16) {
          *(undefined2 *)
           ((long)cctx->hashTable + (ulong)((uint)((int)*plVar21 * -0x61c8864f) >> 0x13) * 2) = 0;
        }
        else {
          cctx->hashTable[(ulong)(*plVar21 * -0x30e4432345000000) >> 0x34] = 0;
        }
      }
    }
  }
  if (uVar10 < 0xf) {
    *dst = (char)*(short *)dst + (char)uVar10;
    dst = (char *)psVar27;
  }
  else {
    *dst = (char)*(short *)dst + '\x0f';
    psVar27[0] = -1;
    psVar27[1] = -1;
    uVar10 = uVar10 - 0xf;
    psVar28 = psVar27;
    for (uVar9 = uVar10; psVar28 = psVar28 + 2, 0x3fb < uVar9; uVar9 = uVar9 - 0x3fc) {
      psVar28[0] = -1;
      psVar28[1] = -1;
      psVar27 = psVar27 + 2;
      uVar10 = uVar10 - 0x3fc;
    }
    pcVar29 = (char *)((long)psVar27 + (ulong)(uVar10 & 0xffff) / 0xff);
    *pcVar29 = (char)((uVar10 & 0xffff) / 0xff) + (char)uVar10;
    dst = pcVar29 + 1;
  }
  if (src + ((ulong)(uint)srcSize - 0xb) <= plVar26) goto LAB_01e1bae5;
  LZ4_putPosition((BYTE *)((long)plVar26 + -2),cctx,tableType,srcBase);
  if (tableType == byU16) {
    uVar17 = (ulong)((uint)((int)*plVar26 * -0x61c8864f) >> 0x13);
LAB_01e1b908:
    uVar9 = (uint)*(ushort *)((long)cctx->hashTable + uVar17 * 2);
  }
  else {
    uVar17 = (ulong)(*plVar26 * -0x30e4432345000000) >> 0x34;
    if (tableType != byU32) goto LAB_01e1b908;
    uVar9 = cctx->hashTable[uVar17];
  }
  uVar25 = (ulong)uVar9;
  if (dictDirective == usingDictCtx) {
    if (uVar9 < uVar2) {
      uVar25 = (ulong)pLVar4->hashTable[uVar17];
      uVar9 = pLVar4->hashTable[uVar17] + iVar23;
LAB_01e1b939:
      piVar22 = (int *)(uVar25 + local_a0);
      local_b0 = piVar5;
    }
    else {
LAB_01e1b945:
      piVar22 = (int *)(srcBase + uVar25);
      local_b0 = (int *)src;
    }
  }
  else {
    if (dictDirective == usingExtDict) {
      if (uVar2 <= uVar9) goto LAB_01e1b945;
      goto LAB_01e1b939;
    }
    piVar22 = (int *)(srcBase + uVar25);
  }
  uVar10 = (uint)((long)plVar26 - (long)srcBase);
  if (tableType == byU16) {
    *(short *)((long)cctx->hashTable + uVar17 * 2) = (short)((long)plVar26 - (long)srcBase);
  }
  else {
    cctx->hashTable[uVar17] = uVar10;
  }
  local_c8 = plVar26;
  if ((dictIssue != dictSmall) || (uVar2 - uVar3 <= uVar9)) {
    if ((tableType != byU16) && (uVar9 + 0xffff < uVar10)) goto LAB_01e1ba8e;
    if (*piVar22 != (int)*plVar26) goto LAB_01e1ba6c;
    psVar28 = (short *)((long)dst + 1);
    *dst = '\0';
    if (dVar14 == usingExtDict) {
      local_bc = uVar10 - uVar9;
    }
    goto LAB_01e1b717;
  }
LAB_01e1ba6c:
  if (tableType == byU16) {
    uVar25 = (ulong)((uint)(*(int *)((long)plVar26 + 1) * -0x61c8864f) >> 0x13);
  }
  else {
LAB_01e1ba8e:
    uVar25 = (ulong)(*(long *)((long)plVar26 + 1) * -0x30e4432345000000) >> 0x34;
  }
  plVar20 = (long *)((long)plVar26 + 1);
  goto LAB_01e1b4f4;
}

Assistant:

LZ4_FORCE_INLINE int LZ4_compress_generic(
                 LZ4_stream_t_internal* const cctx,
                 const char* const src,
                 char* const dst,
                 const int srcSize,
                 int *inputConsumed, /* only written when outputDirective == fillOutput */
                 const int dstCapacity,
                 const limitedOutput_directive outputDirective,
                 const tableType_t tableType,
                 const dict_directive dictDirective,
                 const dictIssue_directive dictIssue,
                 const int acceleration)
{
    DEBUGLOG(5, "LZ4_compress_generic: srcSize=%i, dstCapacity=%i",
                srcSize, dstCapacity);

    if ((U32)srcSize > (U32)LZ4_MAX_INPUT_SIZE) { return 0; }  /* Unsupported srcSize, too large (or negative) */
    if (srcSize == 0) {   /* src == NULL supported if srcSize == 0 */
        if (outputDirective != notLimited && dstCapacity <= 0) return 0;  /* no output, can't write anything */
        DEBUGLOG(5, "Generating an empty block");
        assert(outputDirective == notLimited || dstCapacity >= 1);
        assert(dst != NULL);
        dst[0] = 0;
        if (outputDirective == fillOutput) {
            assert (inputConsumed != NULL);
            *inputConsumed = 0;
        }
        return 1;
    }
    assert(src != NULL);

    return LZ4_compress_generic_validated(cctx, src, dst, srcSize,
                inputConsumed, /* only written into if outputDirective == fillOutput */
                dstCapacity, outputDirective,
                tableType, dictDirective, dictIssue, acceleration);
}